

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O3

void __thiscall bdHashSet::bdHashSet(bdHashSet *this,bdNodeId *id)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  
  *(undefined4 *)((this->mId).data + 0x10) = *(undefined4 *)(id->data + 0x10);
  uVar2 = *(undefined8 *)(id->data + 8);
  *(undefined8 *)(this->mId).data = *(undefined8 *)id->data;
  *(undefined8 *)((this->mId).data + 8) = uVar2;
  p_Var1 = &(this->mEntries)._M_t._M_impl.super__Rb_tree_header;
  (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

bdHashSet::bdHashSet(bdNodeId *id)
	:mId(*id) {
	return;
}